

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QAbstractItemView * __thiscall
QColumnViewPrivate::createColumn(QColumnViewPrivate *this,QModelIndex *index,bool show)

{
  initializer_list<QMetaObject::Connection> __l;
  bool bVar1;
  int iVar2;
  QColumnView *pQVar3;
  ulong uVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  reference piVar7;
  QAbstractItemView **ppQVar8;
  byte in_DL;
  undefined8 in_RSI;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int initialWidth;
  QColumnViewGrip *grip;
  QColumnView *q;
  Connection clickedConnection;
  QAbstractItemView *view;
  code *in_stack_fffffffffffffda8;
  code *t;
  QWidget *in_stack_fffffffffffffdb0;
  QWidget *in_stack_fffffffffffffdb8;
  QAbstractItemView *pQVar9;
  QWidget *in_stack_fffffffffffffdc0;
  QList<int> *this_00;
  QWidget *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  QWidget *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  QColumnViewPrivate *in_stack_fffffffffffffdf8;
  Object *in_stack_fffffffffffffe00;
  ConnectionType type;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  Object *in_stack_fffffffffffffe10;
  QColumnViewPrivate *in_stack_fffffffffffffe20;
  Function in_stack_fffffffffffffe30;
  Connection *slot;
  Connection *local_1c8;
  QAbstractItemView *in_stack_fffffffffffffe40;
  long local_f0;
  qsizetype local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  Connection local_c8;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  int local_6c;
  int local_68;
  undefined1 local_64 [4];
  code *local_60;
  undefined8 local_58;
  Connection local_50;
  Connection local_48;
  QAbstractItemView *local_40;
  Connection local_38 [5];
  Connection CStack_10;
  Connection local_8;
  
  local_8.d_ptr = *(void **)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  local_40 = (QAbstractItemView *)0x0;
  local_48.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::Connection::Connection(&local_48);
  uVar4 = (**(code **)(*(long *)(in_RDI->super_QAbstractItemViewPrivate).model + 0x88))();
  if ((uVar4 & 1) == 0) {
    if (in_RDI->previewColumn == (QAbstractItemView *)0x0) {
      operator_new(0x28);
      memset(local_64,0,4);
      QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x8628d3);
      QWidget::QWidget(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                       (QFlagsStorageHelper<Qt::WindowType,_4>)
                       SUB84((ulong)in_stack_fffffffffffffdc8 >> 0x20,0));
      setPreviewWidget((QColumnViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
    }
    in_stack_fffffffffffffe40 = in_RDI->previewColumn;
    local_40 = in_stack_fffffffffffffe40;
    local_68 = QWidget::minimumWidth(in_stack_fffffffffffffdb0);
    local_6c = QWidget::minimumWidth(in_stack_fffffffffffffdb0);
    qMax<int>(&local_68,&local_6c);
    QWidget::setMinimumWidth
              ((QWidget *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  }
  else {
    local_40 = (QAbstractItemView *)
               (**(code **)(*(long *)&(pQVar3->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget + 0x300))(pQVar3,in_RSI);
    local_60 = clicked;
    local_58 = 0;
    in_stack_fffffffffffffda8 = clicked;
    in_stack_fffffffffffffdb0 = (QWidget *)0x0;
    QObjectPrivate::
    connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QColumnViewPrivate::*)(QModelIndex_const&)>
              (in_stack_fffffffffffffe10,
               (offset_in_QAbstractItemView_to_subr)in_stack_fffffffffffffe40,
               (Object *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               in_stack_fffffffffffffe30,(ConnectionType)((ulong)in_stack_fffffffffffffe00 >> 0x20))
    ;
    QMetaObject::Connection::operator=
              ((Connection *)in_stack_fffffffffffffdb0,(Connection *)in_stack_fffffffffffffda8);
    QMetaObject::Connection::~Connection(&local_50);
  }
  local_80 = QAbstractItemView::activated;
  local_78 = 0;
  uVar4 = (ulong)in_stack_fffffffffffffda8 & 0xffffffff00000000;
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffe00,
             (offset_in_QAbstractItemView_to_subr)in_stack_fffffffffffffe20,
             (ContextType *)in_stack_fffffffffffffdf8,
             (offset_in_QAbstractItemView_to_subr *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (ConnectionType)in_stack_fffffffffffffe40);
  local_90 = QAbstractItemView::clicked;
  local_88 = 0;
  uVar4 = uVar4 & 0xffffffff00000000;
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffe00,
             (offset_in_QAbstractItemView_to_subr)in_stack_fffffffffffffe20,
             (ContextType *)in_stack_fffffffffffffdf8,
             (offset_in_QAbstractItemView_to_subr *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (ConnectionType)in_stack_fffffffffffffe40);
  local_a0 = QAbstractItemView::doubleClicked;
  local_98 = 0;
  uVar4 = uVar4 & 0xffffffff00000000;
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffe00,
             (offset_in_QAbstractItemView_to_subr)in_stack_fffffffffffffe20,
             (ContextType *)in_stack_fffffffffffffdf8,
             (offset_in_QAbstractItemView_to_subr *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (ConnectionType)in_stack_fffffffffffffe40);
  local_b0 = QAbstractItemView::entered;
  local_a8 = 0;
  uVar4 = uVar4 & 0xffffffff00000000;
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffe00,
             (offset_in_QAbstractItemView_to_subr)in_stack_fffffffffffffe20,
             (ContextType *)in_stack_fffffffffffffdf8,
             (offset_in_QAbstractItemView_to_subr *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (ConnectionType)in_stack_fffffffffffffe40);
  local_c0 = QAbstractItemView::pressed;
  local_b8 = 0;
  t = (code *)(uVar4 & 0xffffffff00000000);
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffe00,
             (offset_in_QAbstractItemView_to_subr)in_stack_fffffffffffffe20,
             (ContextType *)in_stack_fffffffffffffdf8,
             (offset_in_QAbstractItemView_to_subr *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (ConnectionType)in_stack_fffffffffffffe40);
  QMetaObject::Connection::Connection(&CStack_10,&local_48);
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::operator[]((QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                *)in_stack_fffffffffffffdc0,(QAbstractItemView **)in_stack_fffffffffffffdb8);
  __l._M_array._4_4_ = in_stack_fffffffffffffdd4;
  __l._M_array._0_4_ = in_stack_fffffffffffffdd0;
  __l._M_len = (size_type)in_stack_fffffffffffffdd8;
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::operator=
            ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
             in_stack_fffffffffffffdc8,__l);
  slot = local_38;
  local_1c8 = &local_8;
  do {
    local_1c8 = local_1c8 + -1;
    QMetaObject::Connection::~Connection(local_1c8);
    type = (ConnectionType)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  } while (local_1c8 != slot);
  QWidget::setFocusPolicy(in_stack_fffffffffffffdb0,(FocusPolicy)((ulong)t >> 0x20));
  QWidget::setParent((QWidget *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdc8);
  if ((in_RDI->showResizeGrips & 1U) != 0) {
    operator_new(0x28);
    QColumnViewGrip::QColumnViewGrip
              ((QColumnViewGrip *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    QAbstractScrollArea::setCornerWidget
              ((QAbstractScrollArea *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffe20 = (QColumnViewPrivate *)&in_RDI->gripConnections;
    local_d8 = gripMoved;
    local_d0 = 0;
    t = gripMoved;
    in_stack_fffffffffffffdb0 = (QWidget *)0x0;
    QObjectPrivate::connect<void(QColumnViewGrip::*)(int),void(QColumnViewPrivate::*)(int)>
              ((Object *)in_stack_fffffffffffffe10,
               (offset_in_QColumnViewGrip_to_subr)in_stack_fffffffffffffe40,
               (Object *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (Function)slot,type);
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::push_back
              ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
               in_stack_fffffffffffffdb0,(value_type *)t);
    QMetaObject::Connection::~Connection(&local_c8);
  }
  qVar5 = QList<int>::size(&in_RDI->columnSizes);
  qVar6 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
  if (qVar6 < qVar5) {
    in_stack_fffffffffffffdf8 = (QColumnViewPrivate *)&in_RDI->columnSizes;
    QList<QAbstractItemView_*>::size(&in_RDI->columns);
    QList<int>::at((QList<int> *)in_stack_fffffffffffffdb0,(qsizetype)t);
    QWidget::height((QWidget *)0x862e1b);
    QWidget::setGeometry
              (in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
               (int)in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
               (int)in_stack_fffffffffffffdb8);
  }
  else {
    local_e0 = (**(code **)(*(long *)&(local_40->super_QAbstractScrollArea).super_QFrame.
                                      super_QWidget + 0x70))();
    iVar2 = QSize::width((QSize *)0x862e58);
    bVar1 = QWidget::isRightToLeft((QWidget *)0x862e6c);
    if (bVar1) {
      QWidget::width((QWidget *)0x862e93);
      QWidget::height((QWidget *)0x862ebf);
      QWidget::setGeometry
                (in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                 (int)in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                 (int)in_stack_fffffffffffffdb8);
    }
    else {
      QWidget::height((QWidget *)0x862f04);
      QWidget::setGeometry
                (in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                 (int)in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                 (int)in_stack_fffffffffffffdb8);
    }
    this_00 = &in_RDI->columnSizes;
    local_e8 = QList<int>::size(&in_RDI->columnSizes);
    qVar5 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
    local_f0 = qVar5 + 1;
    qMax<long_long>(&local_e8,&local_f0);
    QList<int>::resize(this_00,(qsizetype)in_stack_fffffffffffffdb8);
    QList<QAbstractItemView_*>::size(&in_RDI->columns);
    piVar7 = QList<int>::operator[]((QList<int> *)in_stack_fffffffffffffdb0,(qsizetype)t);
    *piVar7 = iVar2;
  }
  bVar1 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x862fd9);
  if (!bVar1) {
    QList<QAbstractItemView_*>::constLast((QList<QAbstractItemView_*> *)t);
    bVar1 = QWidget::isHidden((QWidget *)0x862ff9);
    if (bVar1) {
      ppQVar8 = QList<QAbstractItemView_*>::constLast((QList<QAbstractItemView_*> *)t);
      (**(code **)(*(long *)&((*ppQVar8)->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                  0x68))(*ppQVar8,1);
    }
  }
  QList<QAbstractItemView_*>::append((QList<QAbstractItemView_*> *)0x86303d,(parameter_type)t);
  doLayout(in_stack_fffffffffffffe20);
  updateScrollbars(in_stack_fffffffffffffdf8);
  if (((in_DL & 1) != 0) && (bVar1 = QWidget::isHidden((QWidget *)0x86306e), bVar1)) {
    (**(code **)(*(long *)&(local_40->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x68))
              (local_40,1);
  }
  pQVar9 = local_40;
  QMetaObject::Connection::~Connection(&local_48);
  if (*(void **)(in_FS_OFFSET + 0x28) != local_8.d_ptr) {
    __stack_chk_fail();
  }
  return pQVar9;
}

Assistant:

QAbstractItemView *QColumnViewPrivate::createColumn(const QModelIndex &index, bool show)
{
    Q_Q(QColumnView);
    QAbstractItemView *view = nullptr;
    QMetaObject::Connection clickedConnection;
    if (model->hasChildren(index)) {
        view = q->createColumn(index);
        clickedConnection = QObjectPrivate::connect(view, &QAbstractItemView::clicked,
                                                    this, &QColumnViewPrivate::clicked);
    } else {
        if (!previewColumn)
            setPreviewWidget(new QWidget(q));
        view = previewColumn;
        view->setMinimumWidth(qMax(view->minimumWidth(), previewWidget->minimumWidth()));
    }

    viewConnections[view] = {
        QObject::connect(view, &QAbstractItemView::activated, q, &QColumnView::activated),
        QObject::connect(view, &QAbstractItemView::clicked, q, &QColumnView::clicked),
        QObject::connect(view, &QAbstractItemView::doubleClicked, q, &QColumnView::doubleClicked),
        QObject::connect(view, &QAbstractItemView::entered, q, &QColumnView::entered),
        QObject::connect(view, &QAbstractItemView::pressed, q, &QColumnView::pressed),
        clickedConnection
    };

    view->setFocusPolicy(Qt::NoFocus);
    view->setParent(viewport);
    Q_ASSERT(view);

    // Setup corner grip
    if (showResizeGrips) {
        QColumnViewGrip *grip = new QColumnViewGrip(view);
        view->setCornerWidget(grip);
        gripConnections.push_back(
            QObjectPrivate::connect(grip, &QColumnViewGrip::gripMoved,
                                    this, &QColumnViewPrivate::gripMoved)
        );
    }

    if (columnSizes.size() > columns.size()) {
        view->setGeometry(0, 0, columnSizes.at(columns.size()), viewport->height());
    } else {
        int initialWidth = view->sizeHint().width();
        if (q->isRightToLeft())
            view->setGeometry(viewport->width() - initialWidth, 0, initialWidth, viewport->height());
        else
            view->setGeometry(0, 0, initialWidth, viewport->height());
        columnSizes.resize(qMax(columnSizes.size(), columns.size() + 1));
        columnSizes[columns.size()] = initialWidth;
    }
    if (!columns.isEmpty() && columns.constLast()->isHidden())
        columns.constLast()->setVisible(true);

    columns.append(view);
    doLayout();
    updateScrollbars();
    if (show && view->isHidden())
        view->setVisible(true);
    return view;
}